

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

BOOL __thiscall
Js::RecyclableProxyObjectWalker::GetGroupObject
          (RecyclableProxyObjectWalker *this,ResolvedObject *pResolvedObject)

{
  Var aValue;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this_00;
  ArenaAllocator *alloc;
  RecyclableProxyObjectDisplay *this_01;
  Type TVar5;
  
  pResolvedObject->name = L"[Proxy]";
  pResolvedObject->propId = -1;
  aValue = (this->super_RecyclableObjectWalker).instance;
  pResolvedObject->obj = aValue;
  pResolvedObject->scriptContext = (this->super_RecyclableObjectWalker).scriptContext;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_008b8f99;
    *puVar4 = 0;
LAB_008b8e48:
    this_00 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_008b8f99;
      *puVar4 = 0;
    }
    TVar5 = ((this_00->type).ptr)->typeId;
    if ((int)TVar5 < 0x58) goto LAB_008b8f40;
    BVar3 = RecyclableObject::IsExternal(this_00);
    if (BVar3 != 0) goto LAB_008b8f40;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar2) {
LAB_008b8f99:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      TVar5 = TypeIds_FirstNumberType;
      if ((((ulong)aValue & 0xffff000000000000) == 0x1000000000000) ||
         (TVar5 = TypeIds_Number, (ulong)aValue >> 0x32 != 0)) goto LAB_008b8f40;
      goto LAB_008b8e48;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_008b8f99;
    TVar5 = TypeIds_FirstNumberType;
  }
  *puVar4 = 0;
LAB_008b8f40:
  pResolvedObject->typeId = TVar5;
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  alloc = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
  this_01 = (RecyclableProxyObjectDisplay *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
  RecyclableProxyObjectDisplay::RecyclableProxyObjectDisplay(this_01,pResolvedObject);
  pResolvedObject->objectDisplay = (IDiagObjectModelDisplay *)this_01;
  (*(this_01->super_RecyclableObjectDisplay).super_IDiagObjectModelDisplay.
    _vptr_IDiagObjectModelDisplay[6])(this_01,0x820);
  return 1;
}

Assistant:

BOOL RecyclableProxyObjectWalker::GetGroupObject(ResolvedObject* pResolvedObject)
    {
        pResolvedObject->name = _u("[Proxy]");
        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->obj = instance;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->address = nullptr;

        pResolvedObject->objectDisplay = Anew(GetArenaFromContext(scriptContext), RecyclableProxyObjectDisplay, pResolvedObject);
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(DBGPROP_ATTRIB_VALUE_READONLY | DBGPROP_ATTRIB_VALUE_IS_FAKE);
        return TRUE;
    }